

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O3

void __thiscall CTcTokenizer::pp_if(CTcTokenizer *this)

{
  size_t sVar1;
  int iVar2;
  tok_if_t state;
  CTcConstVal val;
  CTcConstVal local_30;
  
  local_30.typ_ = TC_CVT_UNK;
  local_30._32_1_ = 0;
  iVar2 = expand_macros_curline(this,0,1,0);
  (this->linebuf_).buf_len_ = 0;
  sVar1 = (this->linebuf_).buf_size_;
  if (iVar2 != 0) {
    if (sVar1 != 0) {
      *(this->linebuf_).buf_ = '\0';
    }
    (this->p_).p_ = (this->linebuf_).buf_;
    push_if(this,TOKIF_IF_YES);
    return;
  }
  if (sVar1 != 0) {
    *(this->linebuf_).buf_ = '\0';
  }
  this->curbuf_ = &this->expbuf_;
  (this->p_).p_ = (this->expbuf_).buf_;
  iVar2 = pp_parse_expr(this,&local_30,1,1,1);
  if (iVar2 == 0) {
    if (local_30.typ_ != TC_CVT_NIL) goto LAB_0021c5fd;
  }
  else {
    local_30.typ_ = TC_CVT_TRUE;
LAB_0021c5fd:
    iVar2 = CTcConstVal::equals_zero(&local_30);
    if (iVar2 == 0) {
      state = TOKIF_IF_YES;
      goto LAB_0021c617;
    }
  }
  state = TOKIF_IF_NO;
LAB_0021c617:
  push_if(this,state);
  return;
}

Assistant:

void CTcTokenizer::pp_if()
{
    CTcConstVal val;
    
    /* expand macros; don't allow reading additional lines */
    if (expand_macros_curline(FALSE, TRUE, FALSE))
        goto do_error;

    /* 
     *   we don't need the original source line any more, and we don't
     *   want to copy it to the preprocessed output, so clear it 
     */
    clear_linebuf();

    /* parse out of the expansion buffer */
    start_new_line(&expbuf_, 0);

    /* parse the preprocessor expression */
    if (pp_parse_expr(&val, TRUE, TRUE, TRUE))
    {
        /* 
         *   we can't get a value; treat the expression as true and
         *   continue parsing, so that we don't throw off the #if nesting
         *   level 
         */
        val.set_bool(TRUE);
    }

    /* push the new state according to the value of the expression */
    push_if(val.get_val_bool() ? TOKIF_IF_YES : TOKIF_IF_NO);

    /* done */
    return;

do_error:
    /* clear the line buffer */
    clear_linebuf();

    /* 
     *   push a true if - even though we can't evaluate the condition, we
     *   can at least avoid a cascade of errors for the matching #endif
     *   and #else 
     */
    push_if(TOKIF_IF_YES);
}